

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QRect __thiscall QAccessibleButton::rect(QAccessibleButton *this)

{
  long lVar1;
  QWidget *this_00;
  QPoint QVar2;
  QStyle *pQVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRect QVar8;
  QRect QVar9;
  QStyleOptionButton opt;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  lVar1 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  if ((*(byte *)(*(long *)(lVar1 + 0x20) + 9) & 0x80) == 0) {
    QVar9 = (QRect)(ZEXT816(0xffffffff) << 0x40);
    uVar5 = 0;
    uVar4 = 0xffffffff;
  }
  else {
    this_00 = (QWidget *)QMetaObject::cast((QObject *)&QCheckBox::staticMetaObject);
    if (this_00 == (QWidget *)0x0) {
      this_00 = (QWidget *)QMetaObject::cast((QObject *)&QRadioButton::staticMetaObject);
      if (this_00 == (QWidget *)0x0) {
        QVar9 = QAccessibleWidget::rect(&this->super_QAccessibleWidget);
        uVar5 = QVar9._0_8_ >> 0x20;
        uVar4 = QVar9._8_8_ >> 0x20;
        goto LAB_0052343e;
      }
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      QVar2 = QWidget::mapToGlobal(this_00,(QPoint *)local_a8);
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
      (**(code **)(*(long *)this_00 + 0x1b8))(this_00,(QStyleOptionButton *)local_a8);
      pQVar3 = QWidget::style(this_00);
      lVar1 = *(long *)pQVar3;
      uVar6 = 9;
    }
    else {
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      QVar2 = QWidget::mapToGlobal(this_00,(QPoint *)local_a8);
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
      (**(code **)(*(long *)this_00 + 0x1b8))(this_00,(QStyleOptionButton *)local_a8);
      pQVar3 = QWidget::style(this_00);
      lVar1 = *(long *)pQVar3;
      uVar6 = 5;
    }
    auVar7 = (**(code **)(lVar1 + 0xc0))(pQVar3,uVar6,local_a8,this_00);
    QIcon::~QIcon(&local_48);
    if (pQStack_60 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_60,2,0x10);
      }
    }
    uVar5 = (auVar7._0_8_ >> 0x20) + ((ulong)QVar2 >> 0x20);
    QVar9._8_8_ = auVar7._8_8_ + (long)QVar2;
    QVar9._0_8_ = auVar7._0_8_ + (long)QVar2;
    uVar4 = (auVar7._8_8_ >> 0x20) + ((ulong)QVar2 >> 0x20);
    QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  }
LAB_0052343e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar8._0_8_ = QVar9._0_8_ & 0xffffffff | uVar5 << 0x20;
    QVar8._8_8_ = QVar9._8_8_ & 0xffffffff | uVar4 << 0x20;
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleButton::rect() const
{
    QAbstractButton *ab = button();
    if (!ab->isVisible())
        return QRect();

#if QT_CONFIG(checkbox)
    if (QCheckBox *cb = qobject_cast<QCheckBox *>(ab)) {
        QPoint wpos = cb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        cb->initStyleOption(&opt);
        return cb->style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, cb).translated(wpos);
    }
#endif
#if QT_CONFIG(radiobutton)
    else if (QRadioButton *rb = qobject_cast<QRadioButton *>(ab)) {
        QPoint wpos = rb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        rb->initStyleOption(&opt);
        return rb->style()->subElementRect(QStyle::SE_RadioButtonClickRect, &opt, rb).translated(wpos);
    }
#endif
    return QAccessibleWidget::rect();
}